

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O1

GaussianSet * AllGaussiansForAM(int am)

{
  _Rb_tree_header *p_Var1;
  pointer paVar2;
  mapped_type *pmVar3;
  _Rb_tree<Gaussian,_Gaussian,_std::_Identity<Gaussian>,_std::less<Gaussian>,_std::allocator<Gaussian>_>
  *in_RDI;
  array<int,_3UL> *it;
  pointer paVar4;
  Gaussian local_30;
  key_type local_24;
  
  p_Var1 = &(in_RDI->_M_impl).super__Rb_tree_header;
  (in_RDI->_M_impl).super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_impl).super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_impl).super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_impl).super__Rb_tree_header._M_node_count = 0;
  pmVar3 = std::
           map<int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>_>
           ::at((map<int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>_>
                 *)&gorder_map,&local_24);
  paVar4 = (pmVar3->super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (pmVar3->super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (paVar4 != paVar2) {
    do {
      local_30.ijk._M_elems._0_8_ = *(undefined8 *)paVar4->_M_elems;
      local_30.ijk._M_elems[2] = paVar4->_M_elems[2];
      std::
      _Rb_tree<Gaussian,_Gaussian,_std::_Identity<Gaussian>,_std::less<Gaussian>,_std::allocator<Gaussian>_>
      ::_M_insert_unique<Gaussian>(in_RDI,&local_30);
      paVar4 = paVar4 + 1;
    } while (paVar4 != paVar2);
  }
  return (GaussianSet *)in_RDI;
}

Assistant:

GaussianSet AllGaussiansForAM(int am)
{
    GaussianSet gs;

    const std::vector<ExpList> & v = gorder_map.at(am);

    for(const auto & it : v)
        gs.insert({it[0], it[1], it[2]});

    return gs;
}